

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internalJSONNode.cpp
# Opt level: O3

JSONNode ** __thiscall internalJSONNode::at_nocase(internalJSONNode *this,json_string *name_t)

{
  char *pcVar1;
  jsonChildren *pjVar2;
  JSONNode *pJVar3;
  internalJSONNode *piVar4;
  pointer pcVar5;
  bool bVar6;
  json_string *__lhs;
  JSONNode **ppJVar7;
  JSONNode **ppJVar8;
  size_type __dnew;
  undefined1 local_78 [40];
  pointer local_50 [2];
  char local_40 [16];
  
  local_78._32_8_ = name_t;
  if ((this->_type & 0xfe) == 4) {
    Fetch(this);
    pjVar2 = this->Children;
    pcVar1 = local_78 + 0x10;
    local_50[0] = (pointer)0x16;
    local_78._0_8_ = pcVar1;
    local_78._0_8_ = std::__cxx11::string::_M_create((ulong *)local_78,(ulong)local_50);
    local_78._16_7_ = SUB87(local_50[0],0);
    local_78[0x17] = (undefined1)((ulong)local_50[0] >> 0x38);
    builtin_strncpy((char *)local_78._0_8_,"Children is null begin",0x16);
    local_78._8_8_ = local_50[0];
    *(char *)(local_78._0_8_ + (long)local_50[0]) = '\0';
    JSONDebug::_JSON_ASSERT(true,(json_string *)local_78);
    if ((char *)local_78._0_8_ != pcVar1) {
      operator_delete((void *)local_78._0_8_);
    }
    ppJVar8 = pjVar2->array;
    pjVar2 = this->Children;
    local_50[0] = (char *)0x14;
    local_78._0_8_ = pcVar1;
    local_78._0_8_ = std::__cxx11::string::_M_create((ulong *)local_78,(ulong)local_50);
    local_78._16_7_ = SUB87(local_50[0],0);
    local_78[0x17] = (undefined1)((ulong)local_50[0] >> 0x38);
    builtin_strncpy((char *)local_78._0_8_,"Children is null end",0x14);
    local_78._8_8_ = local_50[0];
    *(char *)(local_78._0_8_ + (long)local_50[0]) = '\0';
    JSONDebug::_JSON_ASSERT(true,(json_string *)local_78);
    if ((char *)local_78._0_8_ != pcVar1) {
      operator_delete((void *)local_78._0_8_);
    }
    ppJVar7 = pjVar2->array + pjVar2->mysize;
    if (ppJVar8 != ppJVar7) {
      do {
        pJVar3 = *ppJVar8;
        if (jsonSingletonERROR_NULL_IN_CHILDREN::getValue[abi:cxx11]()::single == '\0') {
          at_nocase();
        }
        JSONDebug::_JSON_ASSERT
                  (pJVar3 != (JSONNode *)0x0,
                   (json_string *)jsonSingletonERROR_NULL_IN_CHILDREN::getValue[abi:cxx11]()::single
                  );
        pJVar3 = *ppJVar8;
        local_78._16_7_ = 0x65746e69206f6e;
        local_78._23_4_ = 0x6c616e72;
        local_78._8_8_ = (char *)0xb;
        local_78[0x1b] = '\0';
        local_78._0_8_ = pcVar1;
        JSONDebug::_JSON_ASSERT(pJVar3->internal != (internalJSONNode *)0x0,(json_string *)local_78)
        ;
        if ((char *)local_78._0_8_ != pcVar1) {
          operator_delete((void *)local_78._0_8_);
        }
        piVar4 = pJVar3->internal;
        pcVar5 = (piVar4->_name)._M_dataplus._M_p;
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_50,pcVar5,pcVar5 + (piVar4->_name)._M_string_length);
        pcVar5 = local_50[0];
        bVar6 = AreEqualNoCase(local_50[0],*(char **)local_78._32_8_);
        if (pcVar5 != local_40) {
          operator_delete(pcVar5);
        }
        if (bVar6) {
          return ppJVar8;
        }
        ppJVar8 = ppJVar8 + 1;
      } while (ppJVar8 != ppJVar7);
    }
  }
  else {
    __lhs = jsonSingletonERROR_NON_CONTAINER::getValue_abi_cxx11_();
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                   __lhs,"at_nocase");
    at_nocase((internalJSONNode *)local_78);
  }
  return (JSONNode **)0x0;
}

Assistant:

JSONNode ** internalJSONNode::at_nocase(const json_string & name_t) json_nothrow {
	   JSON_ASSERT_SAFE(isContainer(), json_global(ERROR_NON_CONTAINER) + JSON_TEXT("at_nocase"), return 0;);
	   Fetch();
	   json_foreach(CHILDREN, myrunner){
		  JSON_ASSERT(*myrunner, json_global(ERROR_NULL_IN_CHILDREN));
		  if (json_unlikely(AreEqualNoCase((*myrunner) -> name().c_str(), name_t.c_str()))) return myrunner;
	   }
	   return 0;
    }